

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this)

{
  StrWriter *this_local;
  
  operator<<(this,PTR_anon_var_dwarf_e8a7_0063f3c8);
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Ins<I> i)
{
    if constexpr (I == Instr::DBF) {

        if (style.syntax == Syntax::GNU || style.syntax == Syntax::GNU_MIT) {
            *this << "dbf";
        } else {
            *this << "dbra";
        }

    } else {

        *this << mnemonics[(int)I];
    }

    return *this;
}